

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O2

ElementPtr __thiscall
Rml::Factory::InstanceDocumentStream
          (Factory *this,Context *context,Stream *stream,String *document_base_tag)

{
  char *pcVar1;
  ElementDocument *pEVar2;
  ElementPtr element;
  XMLParser parser;
  
  parser.super_BaseXMLParser._vptr_BaseXMLParser = (_func_int **)0x0;
  parser.super_BaseXMLParser.source_url = (URL *)0x0;
  parser.super_BaseXMLParser.xml_source._M_dataplus._M_p = (pointer)0x0;
  InstanceElement((Factory *)&element,(Element *)0x0,document_base_tag,document_base_tag,
                  (XMLAttributes *)&parser);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             *)&parser);
  if ((__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)
      element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0) {
    Log::Message(LT_ERROR,"Failed to instance document, instancer returned nullptr.");
  }
  else {
    pEVar2 = rmlui_dynamic_cast<Rml::ElementDocument*,Rml::Element*>
                       ((Element *)
                        element._M_t.
                        super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
    if (pEVar2 != (ElementDocument *)0x0) {
      pEVar2->context = context;
      XMLParser::XMLParser
                (&parser,(Element *)
                         element._M_t.
                         super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
      BaseXMLParser::Parse(&parser.super_BaseXMLParser,stream);
      *(__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true> *)this =
           element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
      element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
           (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
           (__uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>)0x0;
      XMLParser::~XMLParser(&parser);
      goto LAB_002a05e3;
    }
    pcVar1 = *(char **)(*(long *)(*(long *)element._M_t.
                                           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                           .super__Head_base<0UL,_Rml::Element_*,_false>.
                                           _M_head_impl + -8) + 8);
    Log::Message(LT_ERROR,
                 "Failed to instance document element. Found type \'%s\', was expecting derivative of ElementDocument."
                 ,pcVar1 + (*pcVar1 == '*'));
  }
  *(undefined8 *)this = 0;
LAB_002a05e3:
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&element);
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Factory::InstanceDocumentStream(Context* context, Stream* stream, const String& document_base_tag)
{
	RMLUI_ZoneScoped;

	ElementPtr element = Factory::InstanceElement(nullptr, document_base_tag, document_base_tag, XMLAttributes());
	if (!element)
	{
		Log::Message(Log::LT_ERROR, "Failed to instance document, instancer returned nullptr.");
		return nullptr;
	}

	ElementDocument* document = rmlui_dynamic_cast<ElementDocument*>(element.get());
	if (!document)
	{
		Log::Message(Log::LT_ERROR, "Failed to instance document element. Found type '%s', was expecting derivative of ElementDocument.",
			rmlui_type_name(*element));
		return nullptr;
	}

	document->context = context;

	XMLParser parser(element.get());
	parser.Parse(stream);

	return element;
}